

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

Vec_Ptr_t * Gia_IsoDeriveEquivPos(Gia_Man_t *pGia,int fForward,int fVerbose)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Gia_IsoMan_t *p;
  Vec_Ptr_t *pVVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  undefined1 *puVar12;
  timespec *ptVar13;
  uint uVar14;
  uint uVar15;
  double dVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  timespec ts;
  timespec local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  ptVar13 = &local_88;
  local_70 = (double)CONCAT44(local_70._4_4_,fVerbose);
  iVar3 = clock_gettime(3,&local_88);
  if (iVar3 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  iVar3 = clock_gettime(3,&local_88);
  if (iVar3 < 0) {
    local_78 = -NAN;
  }
  else {
    local_78 = (double)(local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000);
  }
  if (pGia->vCis->nSize < 1) {
    __assert_fail("Gia_ManCiNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2d9,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  if (pGia->vCos->nSize <= pGia->nRegs) {
    __assert_fail("Gia_ManPoNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2da,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  Gia_ManCleanValue(pGia);
  p = Gia_IsoManStart(pGia);
  Gia_IsoPrepare(p);
  Gia_IsoAssignUnique(p);
  iVar3 = clock_gettime(3,&local_88);
  if (iVar3 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
  }
  p->timeStart = lVar11 + lVar10;
  if (local_70._0_4_ != 0) {
    iVar3 = clock_gettime(3,&local_88);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    ptVar13 = (timespec *)0x0;
    Gia_IsoPrint(p,0,lVar10 - (long)local_78);
  }
  if (fForward == 0) {
    puVar12 = (undefined1 *)0x0;
    do {
      uVar6 = (uint)ptVar13;
      iVar3 = (int)puVar12;
      if (p->vClasses->nSize < 1) goto LAB_007592b9;
      bVar18 = true;
      if (iVar3 < 10000) {
        iVar3 = 0;
        uVar14 = 0;
        do {
          do {
            iVar4 = clock_gettime(3,&local_88);
            if (iVar4 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
            }
            iVar5 = (int)puVar12;
            Gia_IsoSimulate(p,iVar5);
            iVar4 = clock_gettime(3,&local_88);
            if (iVar4 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
            }
            p->timeSim = p->timeSim + lVar11 + lVar10;
            iVar4 = clock_gettime(3,&local_88);
            if (iVar4 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
            }
            uVar6 = Gia_IsoSort(p);
            ptVar13 = &local_88;
            iVar4 = clock_gettime(3,&local_88);
            if (iVar4 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
            }
            p->timeRefine = p->timeRefine + lVar11 + lVar10;
            puVar12 = (undefined1 *)(ulong)(iVar5 + 1U);
            if (local_70._0_4_ != 0) {
              iVar4 = clock_gettime(3,&local_88);
              if (iVar4 < 0) {
                lVar10 = -1;
              }
              else {
                lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              ptVar13 = (timespec *)puVar12;
              Gia_IsoPrint(p,iVar5 + 1U,lVar10 - (long)local_78);
            }
            uVar14 = uVar14 | uVar6;
            iVar3 = iVar3 + 1;
            if (uVar6 != 0) {
              iVar3 = 0;
            }
          } while ((iVar5 < 9999) && (iVar3 < 2));
          if (iVar5 < 9999) {
            iVar3 = 0;
            do {
              iVar4 = clock_gettime(3,&local_88);
              if (iVar4 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
              }
              iVar5 = (int)puVar12;
              Gia_IsoSimulateBack(p,iVar5);
              iVar4 = clock_gettime(3,&local_88);
              if (iVar4 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              p->timeSim = p->timeSim + lVar11 + lVar10;
              iVar4 = clock_gettime(3,&local_88);
              if (iVar4 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
              }
              uVar6 = Gia_IsoSort(p);
              ptVar13 = &local_88;
              iVar4 = clock_gettime(3,&local_88);
              if (iVar4 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              p->timeRefine = p->timeRefine + lVar11 + lVar10;
              puVar12 = (undefined1 *)(ulong)(iVar5 + 1U);
              if (local_70._0_4_ != 0) {
                iVar4 = clock_gettime(3,&local_88);
                if (iVar4 < 0) {
                  lVar10 = -1;
                }
                else {
                  lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
                }
                ptVar13 = (timespec *)puVar12;
                Gia_IsoPrint(p,iVar5 + 1U,lVar10 - (long)local_78);
              }
              uVar14 = uVar14 | uVar6;
              iVar3 = iVar3 + 1;
              if (uVar6 != 0) {
                iVar3 = 0;
              }
            } while ((iVar5 < 9999) && (iVar3 < 2));
          }
          bVar18 = uVar14 != 0;
          if (9999 < (int)puVar12) break;
          iVar3 = 0;
          bVar17 = uVar14 != 0;
          uVar14 = 0;
        } while (bVar17);
      }
      uVar6 = (uint)ptVar13;
      iVar3 = (int)puVar12;
    } while (bVar18);
    iVar4 = p->vClasses->nSize;
    while (0 < iVar4) {
      uVar6 = local_70._0_4_;
      Gia_IsoAssignOneClass(p,local_70._0_4_);
      if ((int)puVar12 < 10000) {
        uVar14 = 0;
        do {
          do {
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
            }
            iVar4 = (int)puVar12;
            Gia_IsoSimulateBack(p,iVar4);
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
            }
            p->timeSim = p->timeSim + lVar11 + lVar10;
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
            }
            uVar7 = Gia_IsoSort(p);
            uVar6 = (uint)&local_88;
            iVar3 = clock_gettime(3,&local_88);
            if (iVar3 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
            }
            p->timeRefine = p->timeRefine + lVar11 + lVar10;
            uVar15 = iVar4 + 1;
            puVar12 = (undefined1 *)(ulong)uVar15;
            if (local_70._0_4_ != 0) {
              iVar3 = clock_gettime(3,&local_88);
              if (iVar3 < 0) {
                lVar10 = -1;
              }
              else {
                lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              uVar6 = uVar15;
              Gia_IsoPrint(p,uVar15,lVar10 - (long)local_78);
            }
            uVar14 = uVar14 | uVar7;
          } while (iVar4 < 9999 && uVar7 != 0);
          if (iVar4 < 9999) {
            do {
              iVar3 = clock_gettime(3,&local_88);
              if (iVar3 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
              }
              iVar4 = (int)puVar12;
              Gia_IsoSimulate(p,iVar4);
              iVar3 = clock_gettime(3,&local_88);
              if (iVar3 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              p->timeSim = p->timeSim + lVar11 + lVar10;
              iVar3 = clock_gettime(3,&local_88);
              if (iVar3 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
              }
              uVar7 = Gia_IsoSort(p);
              uVar6 = (uint)&local_88;
              iVar3 = clock_gettime(3,&local_88);
              if (iVar3 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
              }
              p->timeRefine = p->timeRefine + lVar11 + lVar10;
              uVar15 = iVar4 + 1;
              puVar12 = (undefined1 *)(ulong)uVar15;
              if (local_70._0_4_ != 0) {
                iVar3 = clock_gettime(3,&local_88);
                if (iVar3 < 0) {
                  lVar10 = -1;
                }
                else {
                  lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
                }
                uVar6 = uVar15;
                Gia_IsoPrint(p,uVar15,lVar10 - (long)local_78);
              }
              uVar14 = uVar14 | uVar7;
            } while ((iVar4 < 9999) && (uVar7 != 0));
          }
        } while (((int)puVar12 < 10000) && (bVar18 = uVar14 != 0, uVar14 = 0, bVar18));
      }
      iVar3 = (int)puVar12;
      iVar4 = p->vClasses->nSize;
    }
LAB_007592b9:
    if (local_70._0_4_ != 0) {
      iVar4 = clock_gettime(3,&local_88);
      if (iVar4 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      Gia_IsoPrint(p,iVar3 + 2,lVar10 - (long)local_78);
LAB_0075931a:
      iVar4 = 3;
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        dVar16 = -NAN;
      }
      else {
        dVar16 = (double)(local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000);
      }
      lVar10 = p->timeRefine;
      local_38 = 0.0;
      lVar11 = (long)dVar16 - (long)local_78;
      local_70 = (double)lVar11;
      if (lVar11 != 0) {
        local_38 = (local_70 * 100.0) / local_70;
      }
      lVar11 = lVar11 - (p->timeStart + p->timeSim + lVar10);
      local_68 = (double)p->timeStart;
      local_48 = 0.0;
      bVar18 = (long)dVar16 - (long)local_78 != 0;
      p->timeTotal = (long)dVar16 - (long)local_78;
      p->timeOther = lVar11;
      if (bVar18) {
        local_48 = (local_68 * 100.0) / local_70;
      }
      local_50 = (double)p->timeSim;
      local_58 = 0.0;
      if (bVar18) {
        local_58 = (local_50 * 100.0) / local_70;
      }
      local_68 = local_68 / 1000000.0;
      local_50 = local_50 / 1000000.0;
      local_60 = (double)lVar11;
      local_40 = 0.0;
      if (bVar18) {
        local_40 = (local_60 * 100.0) / local_70;
      }
      Abc_Print(iVar4,"%s =","Start    ");
      Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_68,local_48);
      Abc_Print(iVar4,"%s =","Simulate ");
      Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_50,local_58);
      Abc_Print(iVar4,"%s =","Refine   ");
      dVar21 = (double)p->timeSort;
      local_68 = 0.0;
      if (dVar16 != local_78) {
        local_68 = (dVar21 * 100.0) / local_70;
      }
      dVar20 = (double)(lVar10 - p->timeSort);
      dVar19 = 0.0;
      if (dVar16 != local_78) {
        dVar19 = (dVar20 * 100.0) / local_70;
      }
      local_78 = dVar21 / 1000000.0;
      local_60 = local_60 / 1000000.0;
      local_70 = local_70 / 1000000.0;
      Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar20 / 1000000.0,dVar19);
      Abc_Print(iVar4,"%s =","Sort     ");
      Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_78,local_68);
      Abc_Print(iVar4,"%s =","Other    ");
      Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_60,local_40);
      Abc_Print(iVar4,"%s =","TOTAL    ");
      uVar6 = 0x9965d7;
      Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_70,local_38);
    }
  }
  else {
    iVar3 = 0;
    uVar14 = 0;
    do {
      while( true ) {
        iVar4 = clock_gettime(3,&local_88);
        if (iVar4 < 0) {
          lVar10 = 1;
        }
        else {
          lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
          lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
        }
        Gia_IsoSimulate(p,uVar14);
        iVar4 = clock_gettime(3,&local_88);
        if (iVar4 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        p->timeSim = p->timeSim + lVar11 + lVar10;
        iVar4 = clock_gettime(3,&local_88);
        if (iVar4 < 0) {
          lVar10 = 1;
        }
        else {
          lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
          lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_88.tv_sec * -1000000;
        }
        iVar4 = Gia_IsoSort(p);
        uVar6 = (uint)&local_88;
        iVar5 = clock_gettime(3,&local_88);
        if (iVar5 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        p->timeRefine = p->timeRefine + lVar11 + lVar10;
        uVar7 = uVar14 + 1;
        if (local_70._0_4_ == 0) break;
        iVar5 = clock_gettime(3,&local_88);
        if (iVar5 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        Gia_IsoPrint(p,uVar7,lVar10 - (long)local_78);
        iVar3 = iVar3 + 1;
        if (iVar4 != 0) {
          iVar3 = 0;
        }
        if ((0x270e < uVar14) || (uVar14 = uVar7, 1 < iVar3)) goto LAB_0075931a;
      }
      iVar3 = iVar3 + 1;
      if (iVar4 != 0) {
        iVar3 = 0;
      }
    } while ((uVar14 < 9999) && (uVar14 = uVar7, iVar3 < 2));
  }
  pGVar1 = p->pGia;
  if (pGVar1->vCos->nSize - pGVar1->nRegs < 2) {
    pVVar8 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar8 = Gia_IsoCollectCosClasses(p,uVar6);
  }
  iVar3 = pGVar1->nObjs;
  if ((0 < (long)iVar3) && (pGVar1->pObjs != (Gia_Obj_t *)0x0)) {
    piVar2 = p->pUniques;
    puVar9 = &pGVar1->pObjs->Value;
    lVar10 = 0;
    do {
      *puVar9 = piVar2[lVar10];
      lVar10 = lVar10 + 1;
      puVar9 = puVar9 + 3;
    } while (iVar3 != lVar10);
  }
  Gia_IsoManStop(p);
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Gia_IsoDeriveEquivPos( Gia_Man_t * pGia, int fForward, int fVerbose )
{
    int nIterMax = 10000;
    int nFixedPoint = 1;
    Gia_IsoMan_t * p;
    Vec_Ptr_t * vEquivs = NULL;
    int fRefined, fRefinedAll;
    int i, c;
    abctime clk = Abc_Clock(), clkTotal = Abc_Clock();
    assert( Gia_ManCiNum(pGia) > 0 );
    assert( Gia_ManPoNum(pGia) > 0 );

    Gia_ManCleanValue( pGia );
    p = Gia_IsoManStart( pGia );
    Gia_IsoPrepare( p );
    Gia_IsoAssignUnique( p );
    p->timeStart = Abc_Clock() - clk;
    if ( fVerbose )
        Gia_IsoPrint( p, 0, Abc_Clock() - clkTotal );

//    Gia_IsoRecognizeMuxes( pGia );

    i = 0;
    if ( fForward )
    {
        for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
        {
            clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
            clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
            if ( fVerbose )
                Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
        }
    }
    else
    {
        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
            }
            if ( !fRefinedAll )
                break;
        }

//        Gia_IsoReportTopmost( p );

        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            Gia_IsoAssignOneClass( p, fVerbose );
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
//                    if ( fRefined )
//                        printf( "Refinedment happened.\n" );
                }
            }
        }

        if ( fVerbose )
            Gia_IsoPrint( p, i+2, Abc_Clock() - clkTotal );
    }
//    Gia_IsoPrintClasses( p );
    if ( fVerbose )
    {
        p->timeTotal = Abc_Clock() - clkTotal;
        p->timeOther = p->timeTotal - p->timeStart - p->timeSim - p->timeRefine;
        ABC_PRTP( "Start    ", p->timeStart,              p->timeTotal );
        ABC_PRTP( "Simulate ", p->timeSim,                p->timeTotal );
        ABC_PRTP( "Refine   ", p->timeRefine-p->timeSort, p->timeTotal );
        ABC_PRTP( "Sort     ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }

    if ( Gia_ManPoNum(p->pGia) > 1 )
        vEquivs = Gia_IsoCollectCosClasses( p, fVerbose );
    Gia_IsoManTransferUnique( p );
    Gia_IsoManStop( p );

    return vEquivs;
}